

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O0

bool __thiscall
crnlib::mipmapped_texture::write_to_file
          (mipmapped_texture *this,char *pFilename,format file_format,crn_comp_params *pComp_params,
          uint32 *pActual_quality_level,float *pActual_bitrate,uint32 image_write_flags)

{
  bool bVar1;
  uint uVar2;
  long in_RCX;
  format in_EDX;
  char *in_RSI;
  undefined4 *in_R8;
  undefined4 *in_R9;
  data_stream_serializer serializer;
  cfile_stream write_stream;
  bool success;
  data_stream_serializer *in_stack_00000138;
  mipmapped_texture *in_stack_00000140;
  data_stream_serializer *in_stack_00000180;
  mipmapped_texture *in_stack_00000188;
  float *in_stack_000015e8;
  uint32 *in_stack_000015f0;
  crn_comp_params *in_stack_000015f8;
  char *in_stack_00001600;
  mipmapped_texture *in_stack_00001608;
  char *in_stack_ffffffffffffff18;
  undefined2 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff22;
  undefined1 in_stack_ffffffffffffff23;
  format in_stack_ffffffffffffff24;
  data_stream *in_stack_ffffffffffffff48;
  dynamic_string local_a0;
  uint32 in_stack_ffffffffffffff7c;
  _func_int **in_stack_ffffffffffffff80;
  mipmapped_texture *in_stack_ffffffffffffff88;
  bool local_39;
  byte local_1;
  
  if (in_R8 != (undefined4 *)0x0) {
    *in_R8 = 0;
  }
  if (in_R9 != (undefined4 *)0x0) {
    *in_R9 = 0;
  }
  bVar1 = is_valid((mipmapped_texture *)0x172e17);
  if (bVar1) {
    if (in_EDX == cFormatInvalid) {
      in_EDX = texture_file_types::determine_file_format((char *)in_stack_ffffffffffffff48);
    }
    if (in_EDX == cFormatInvalid) {
      set_last_error((mipmapped_texture *)
                     CONCAT44(in_stack_ffffffffffffff24,
                              CONCAT13(in_stack_ffffffffffffff23,
                                       CONCAT12(in_stack_ffffffffffffff22,in_stack_ffffffffffffff20)
                                      )),in_stack_ffffffffffffff18);
      local_1 = 0;
    }
    else {
      local_39 = false;
      if (((in_RCX == 0) || (in_EDX != cFormatDDS)) && (in_EDX != cFormatCRN)) {
        bVar1 = texture_file_types::supports_mipmaps(in_EDX);
        if (bVar1) {
          if (in_RCX != 0) {
            console::warning(
                            "mipmapped_texture::write_to_file: Ignoring CRN compression parameters (currently unsupported for this file type)."
                            );
          }
          cfile_stream::cfile_stream
                    ((cfile_stream *)
                     CONCAT44(in_stack_ffffffffffffff24,
                              CONCAT13(in_stack_ffffffffffffff23,
                                       CONCAT12(in_stack_ffffffffffffff22,in_stack_ffffffffffffff20)
                                      )));
          uVar2 = cfile_stream::open((cfile_stream *)&stack0xffffffffffffff80,in_RSI,6,0);
          if ((uVar2 & 1) == 0) {
            dynamic_string::dynamic_string
                      (&local_a0,cVarArg,"Failed creating output file \"%s\"",in_RSI);
            dynamic_string::get_ptr(&local_a0);
            set_last_error((mipmapped_texture *)
                           CONCAT44(in_stack_ffffffffffffff24,
                                    CONCAT13(in_stack_ffffffffffffff23,
                                             CONCAT12(in_stack_ffffffffffffff22,
                                                      in_stack_ffffffffffffff20))),
                           in_stack_ffffffffffffff18);
            dynamic_string::~dynamic_string
                      ((dynamic_string *)
                       CONCAT44(in_stack_ffffffffffffff24,
                                CONCAT13(in_stack_ffffffffffffff23,
                                         CONCAT12(in_stack_ffffffffffffff22,
                                                  in_stack_ffffffffffffff20))));
            local_1 = 0;
            bVar1 = true;
          }
          else {
            in_stack_ffffffffffffff24 = in_EDX;
            data_stream_serializer::data_stream_serializer
                      ((data_stream_serializer *)&stack0xffffffffffffff48,
                       (data_stream *)&stack0xffffffffffffff80);
            if (in_stack_ffffffffffffff24 == cFormatDDS) {
              in_stack_ffffffffffffff23 = write_dds(in_stack_00000188,in_stack_00000180);
              local_39 = (bool)in_stack_ffffffffffffff23;
            }
            else if (in_stack_ffffffffffffff24 == cFormatKTX) {
              in_stack_ffffffffffffff22 = write_ktx(in_stack_00000140,in_stack_00000138);
              local_39 = (bool)in_stack_ffffffffffffff22;
            }
            bVar1 = false;
          }
          cfile_stream::~cfile_stream
                    ((cfile_stream *)
                     CONCAT44(in_stack_ffffffffffffff24,
                              CONCAT13(in_stack_ffffffffffffff23,
                                       CONCAT12(in_stack_ffffffffffffff22,in_stack_ffffffffffffff20)
                                      )));
          if (bVar1) goto LAB_001730c8;
        }
        else {
          local_39 = write_regular_image(in_stack_ffffffffffffff88,(char *)in_stack_ffffffffffffff80
                                         ,in_stack_ffffffffffffff7c);
        }
      }
      else {
        if (in_RCX == 0) {
          local_1 = 0;
          goto LAB_001730c8;
        }
        local_39 = write_comp_texture(in_stack_00001608,in_stack_00001600,in_stack_000015f8,
                                      in_stack_000015f0,in_stack_000015e8);
      }
      local_1 = local_39;
    }
  }
  else {
    set_last_error((mipmapped_texture *)
                   CONCAT44(in_stack_ffffffffffffff24,
                            CONCAT13(in_stack_ffffffffffffff23,
                                     CONCAT12(in_stack_ffffffffffffff22,in_stack_ffffffffffffff20)))
                   ,in_stack_ffffffffffffff18);
    local_1 = 0;
  }
LAB_001730c8:
  return (bool)(local_1 & 1);
}

Assistant:

bool mipmapped_texture::write_to_file(
    const char* pFilename,
    texture_file_types::format file_format,
    crn_comp_params* pComp_params,
    uint32* pActual_quality_level, float* pActual_bitrate,
    uint32 image_write_flags) {
  if (pActual_quality_level)
    *pActual_quality_level = 0;
  if (pActual_bitrate)
    *pActual_bitrate = 0.0f;

  if (!is_valid()) {
    set_last_error("Unable to write empty texture");
    return false;
  }

  if (file_format == texture_file_types::cFormatInvalid)
    file_format = texture_file_types::determine_file_format(pFilename);

  if (file_format == texture_file_types::cFormatInvalid) {
    set_last_error("Unknown file format");
    return false;
  }

  bool success = false;

  if (((pComp_params) && (file_format == texture_file_types::cFormatDDS)) ||
      (file_format == texture_file_types::cFormatCRN)) {
    if (!pComp_params)
      return false;
    success = write_comp_texture(pFilename, *pComp_params, pActual_quality_level, pActual_bitrate);
  } else if (!texture_file_types::supports_mipmaps(file_format)) {
    success = write_regular_image(pFilename, image_write_flags);
  } else {
    if (pComp_params) {
      console::warning("mipmapped_texture::write_to_file: Ignoring CRN compression parameters (currently unsupported for this file type).");
    }

    cfile_stream write_stream;
    if (!write_stream.open(pFilename, cDataStreamWritable | cDataStreamSeekable)) {
      set_last_error(dynamic_string(cVarArg, "Failed creating output file \"%s\"", pFilename).get_ptr());
      return false;
    }
    data_stream_serializer serializer(write_stream);

    switch (file_format) {
      case texture_file_types::cFormatDDS: {
        success = write_dds(serializer);
        break;
      }
      case texture_file_types::cFormatKTX: {
        success = write_ktx(serializer);
        break;
      }
      default: {
        break;
      }
    }
  }

  return success;
}